

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O0

void __thiscall
wasm::TypeMapper::modifyContinuation(TypeMapper *this,HeapType oldType,Continuation *continuation)

{
  HeapType HVar1;
  Continuation *continuation_local;
  TypeMapper *this_local;
  HeapType oldType_local;
  
  this_local = (TypeMapper *)oldType.id;
  HVar1.id = (uintptr_t)HeapType::getContinuation((HeapType *)&this_local);
  HVar1 = getNewHeapType(this,HVar1);
  (continuation->type).id = HVar1.id;
  return;
}

Assistant:

void modifyContinuation(HeapType oldType,
                          Continuation& continuation) override {
    continuation.type = getNewHeapType(oldType.getContinuation().type);
  }